

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

bool __thiscall pbrt::syntactic::ParamSet::hasParamString(ParamSet *this,string *name)

{
  undefined1 local_20 [16];
  
  findParam<std::__cxx11::string>((ParamSet *)local_20,(string *)this);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return local_20._0_8_ != 0;
}

Assistant:

bool hasParamString(const std::string &name) const {
        return (bool)findParam<std::string>(name);
      }